

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

void test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
               (unsigned_long_long num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  double dVar1;
  int iVar2;
  mp_type mVar3;
  char *pcVar4;
  unsigned_long_long uVar5;
  uint64_t uVar6;
  float fVar7;
  double dVar8;
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float local_284;
  double dStack_270;
  int rc;
  double num2;
  char *mp_num_pos2;
  int *piStack_258;
  char code;
  char *mp_num_pos1;
  int i;
  int count;
  char mp_nums [16] [16];
  char *pos;
  char *end;
  char str [256];
  int str_cap;
  bool is_ok_local;
  _func_int_char_ptr_ptr_double_ptr *read_f_local;
  unsigned_long_long num1_local;
  
  iVar2 = snprintf((char *)&end,0x100,"typed read of ");
  pcVar4 = str + (long)iVar2 + -8;
  iVar2 = snprintf(pcVar4,(size_t)(str + (0xf8 - (long)pcVar4)),"%llu",num1);
  pcVar4 = pcVar4 + iVar2;
  iVar2 = snprintf(pcVar4,(size_t)(str + (0xf8 - (long)pcVar4))," into ");
  snprintf(pcVar4 + iVar2,(size_t)(str + (0xf8 - (long)(pcVar4 + iVar2))),"double");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"%s",&end);
  fprintf(_stdout,"\n");
  mp_num_pos1._4_4_ = 0;
  iVar2 = test_encode_uint_all_sizes((char (*) [16])&i,num1);
  mp_num_pos1._4_4_ = iVar2 + mp_num_pos1._4_4_;
  if (num1 < 0x8000000000000000) {
    iVar2 = test_encode_int_all_sizes((char (*) [16])(&i + (long)mp_num_pos1._4_4_ * 4),num1);
    mp_num_pos1._4_4_ = iVar2 + mp_num_pos1._4_4_;
  }
  mp_num_pos1._0_4_ = 0;
  do {
    if (mp_num_pos1._4_4_ <= (int)mp_num_pos1) {
      return;
    }
    piStack_258 = &i + (long)(int)mp_num_pos1 * 4;
    mp_num_pos2._7_1_ = (char)*piStack_258;
    mVar3 = mp_typeof((char)*piStack_258);
    uVar11 = (undefined4)(num1 >> 0x20);
    if (mVar3 == MP_INT) {
      uVar5 = mp_decode_int((char **)&stack0xfffffffffffffda8);
      if (uVar5 != num1) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                "mp_decode_int(&mp_num_pos1) == (int64_t)num1","false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x727,"test_read_num");
        exit(-1);
      }
    }
    else {
      mVar3 = mp_typeof((char)*piStack_258);
      if (mVar3 == MP_UINT) {
        uVar6 = mp_decode_uint((char **)&stack0xfffffffffffffda8);
        if (uVar6 != num1) {
          fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                  "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1","false",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x72a,"test_read_num");
          exit(-1);
        }
      }
      else {
        mVar3 = mp_typeof((char)*piStack_258);
        if (mVar3 == MP_FLOAT) {
          fVar7 = mp_decode_float((char **)&stack0xfffffffffffffda8);
          local_284 = (float)num1;
          if ((fVar7 != local_284) || (NAN(fVar7) || NAN(local_284))) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "mp_decode_float(&mp_num_pos1) == (float)num1","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x72d,"test_read_num");
            exit(-1);
          }
        }
        else {
          dVar1 = mp_decode_double((char **)&stack0xfffffffffffffda8);
          auVar9._8_4_ = uVar11;
          auVar9._0_8_ = num1;
          auVar9._12_4_ = 0x45300000;
          dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)num1) - 4503599627370496.0);
          if ((dVar1 != dVar8) || (NAN(dVar1) || NAN(dVar8))) {
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
                    "mp_decode_double(&mp_num_pos1) == (double)num1","false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x730,"test_read_num");
            exit(-1);
          }
        }
      }
    }
    num2 = (double)(&i + (long)(int)mp_num_pos1 * 4);
    dStack_270 = 0.0;
    iVar2 = (*read_f)((char **)&num2,&stack0xfffffffffffffd90);
    if (is_ok) {
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",(ulong)(uint)(int)mp_num_pos2._7_1_);
      _ok((uint)(piStack_258 == (int *)num2),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      auVar10._8_4_ = uVar11;
      auVar10._0_8_ = num1;
      auVar10._12_4_ = 0x45300000;
      _ok((uint)(ABS(((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)num1) - 4503599627370496.0)) - dStack_270) <
                1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
    }
    else {
      _ok((uint)(iVar2 == -1),"rc == -1",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x737,"check failure for code 0x%02X",(ulong)(uint)(int)mp_num_pos2._7_1_);
      _ok((uint)((int *)num2 == &i + (long)(int)mp_num_pos1 * 4),"mp_num_pos2 == mp_nums[i]",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x738,"check position");
    }
    mp_num_pos1._0_4_ = (int)mp_num_pos1 + 1;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}